

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

int secp256k1_pedersen_commit_sum
              (secp256k1_context *ctx,secp256k1_pedersen_commitment *commit_out,
              secp256k1_pedersen_commitment **commits,size_t pcnt,
              secp256k1_pedersen_commitment **ncommits,size_t ncnt)

{
  int iVar1;
  ulong in_RCX;
  long in_RDX;
  long in_RSI;
  long in_R8;
  ulong in_R9;
  secp256k1_ge acc;
  int ret;
  size_t i;
  secp256k1_ge add;
  secp256k1_gej accj;
  secp256k1_gej *in_stack_fffffffffffffe78;
  undefined6 in_stack_fffffffffffffe80;
  undefined1 in_stack_fffffffffffffe86;
  undefined1 uVar2;
  undefined1 uVar3;
  secp256k1_pedersen_commitment *in_stack_fffffffffffffe98;
  secp256k1_ge *in_stack_fffffffffffffea0;
  secp256k1_gej *in_stack_fffffffffffffec8;
  secp256k1_ge *in_stack_fffffffffffffed0;
  uint local_11c;
  ulong local_118;
  secp256k1_gej local_b8;
  ulong local_38;
  ulong local_28;
  uint local_4;
  
  uVar3 = in_RCX == 0 || in_RDX != 0;
  if (in_RCX == 0 || in_RDX != 0) {
    uVar2 = in_R9 == 0 || in_R8 != 0;
    if (in_R9 == 0 || in_R8 != 0) {
      if (in_RSI == 0) {
        secp256k1_callback_call
                  ((secp256k1_callback *)CONCAT17(uVar3,CONCAT16(uVar2,in_stack_fffffffffffffe80)),
                   (char *)in_stack_fffffffffffffe78);
        local_4 = 0;
      }
      else {
        local_38 = in_R9;
        local_28 = in_RCX;
        secp256k1_gej_set_infinity((secp256k1_gej *)0x10c29c);
        for (local_118 = 0; local_118 < local_38; local_118 = local_118 + 1) {
          secp256k1_pedersen_commitment_load(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
          secp256k1_gej_add_ge_var
                    ((secp256k1_gej *)acc.y.n[1],(secp256k1_gej *)acc.y.n[0],
                     (secp256k1_ge *)acc.x.n[4],(secp256k1_fe *)acc.x.n[3]);
        }
        secp256k1_gej_neg((secp256k1_gej *)CONCAT17(uVar3,CONCAT16(uVar2,in_stack_fffffffffffffe80))
                          ,in_stack_fffffffffffffe78);
        for (local_118 = 0; local_118 < local_28; local_118 = local_118 + 1) {
          secp256k1_pedersen_commitment_load(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
          secp256k1_gej_add_ge_var
                    ((secp256k1_gej *)acc.y.n[1],(secp256k1_gej *)acc.y.n[0],
                     (secp256k1_ge *)acc.x.n[4],(secp256k1_fe *)acc.x.n[3]);
        }
        iVar1 = secp256k1_gej_is_infinity(&local_b8);
        if (iVar1 == 0) {
          secp256k1_ge_set_gej(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
          secp256k1_pedersen_commitment_save
                    ((secp256k1_pedersen_commitment *)
                     CONCAT17(uVar3,CONCAT16(uVar2,in_stack_fffffffffffffe80)),
                     (secp256k1_ge *)in_stack_fffffffffffffe78);
        }
        local_11c = (uint)(iVar1 == 0);
        local_4 = local_11c;
      }
    }
    else {
      secp256k1_callback_call
                ((secp256k1_callback *)CONCAT17(uVar3,CONCAT16(uVar2,in_stack_fffffffffffffe80)),
                 (char *)in_stack_fffffffffffffe78);
      local_4 = 0;
    }
  }
  else {
    secp256k1_callback_call
              ((secp256k1_callback *)
               CONCAT17(uVar3,CONCAT16(in_stack_fffffffffffffe86,in_stack_fffffffffffffe80)),
               (char *)in_stack_fffffffffffffe78);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int secp256k1_pedersen_commit_sum(const secp256k1_context* ctx, secp256k1_pedersen_commitment *commit_out,
 const secp256k1_pedersen_commitment * const* commits, size_t pcnt, const secp256k1_pedersen_commitment * const* ncommits, size_t ncnt) {
    secp256k1_gej accj;
    secp256k1_ge add;
    size_t i;
    int ret = 0;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(!pcnt || (commits != NULL));
    ARG_CHECK(!ncnt || (ncommits != NULL));
    ARG_CHECK(commit_out != NULL);
    (void) ctx;
    secp256k1_gej_set_infinity(&accj);
    for (i = 0; i < ncnt; i++) {
        secp256k1_pedersen_commitment_load(&add, ncommits[i]);
        secp256k1_gej_add_ge_var(&accj, &accj, &add, NULL);
    }
    secp256k1_gej_neg(&accj, &accj);
    for (i = 0; i < pcnt; i++) {
        secp256k1_pedersen_commitment_load(&add, commits[i]);
        secp256k1_gej_add_ge_var(&accj, &accj, &add, NULL);
    }
    if (!secp256k1_gej_is_infinity(&accj)) {
        secp256k1_ge acc;
        secp256k1_ge_set_gej(&acc, &accj);
        secp256k1_pedersen_commitment_save(commit_out, &acc);
        ret = 1;
    }
    return ret;
}